

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Miter2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  Gia_Man_t *pNew;
  char *pcVar4;
  uint local_64;
  int fVerbose;
  int c;
  int nArgcNew;
  char **pArgvNew;
  char *pInit;
  char *pTemp;
  char *FileName;
  Gia_Man_t *pAux;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_64 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (argc - globalUtilOptind == 1) {
        pcVar4 = argv[globalUtilOptind];
        for (pInit = pcVar4; *pInit != '\0'; pInit = pInit + 1) {
          if (*pInit == '>') {
            *pInit = '\\';
          }
        }
        __stream = fopen(pcVar4,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
          pcVar4 = Extra_FileGetSimilarName
                             (pcVar4,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
          if (pcVar4 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
          }
          Abc_Print(1,"\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          fclose(__stream);
          pcVar4 = Extra_FileReadContents(pcVar4);
          Extra_StringClean(pcVar4,"01xX");
          sVar3 = strlen(pcVar4);
          iVar1 = Gia_ManCiNum(pAbc->pGia);
          if ((int)sVar3 == iVar1) {
            pNew = Gia_ManMiter2(pAbc->pGia,pcVar4,local_64);
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            Abc_FrameUpdateGia(pAbc,pNew);
            pAbc_local._4_4_ = 0;
          }
          else {
            sVar3 = strlen(pcVar4);
            uVar2 = Gia_ManCiNum(pAbc->pGia);
            Abc_Print(-1,"Init string length (%d) differs from PI and flop count (%d).\n",sVar3,
                      (ulong)uVar2);
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            pAbc_local._4_4_ = 1;
          }
        }
      }
      else {
        Abc_Print(-1,"File name is not given on the command line.\n");
        pAbc_local._4_4_ = 1;
      }
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_64 = local_64 ^ 1;
  }
  Abc_Print(-2,"usage: &miter2 [-vh] <file>\n");
  Abc_Print(-2,"\t         creates miter of two copies of the design\n");
  pcVar4 = "no";
  if (local_64 != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : file name with flop initial values (0/1/x/X) [default = required]\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Miter2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    char * FileName, * pTemp, * pInit;
    char ** pArgvNew;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    // extract string
    pInit = Extra_FileReadContents( FileName );
    Extra_StringClean( pInit, "01xX" );
    if ( (int)strlen(pInit) != Gia_ManCiNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Init string length (%d) differs from PI and flop count (%d).\n", strlen(pInit), Gia_ManCiNum(pAbc->pGia) );
        ABC_FREE( pInit );
        return 1;
    }
    // compute the miter
    pAux = Gia_ManMiter2( pAbc->pGia, pInit, fVerbose );
    ABC_FREE( pInit );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter2 [-vh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two copies of the design\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with flop initial values (0/1/x/X) [default = required]\n" );
    return 1;
}